

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  type tVar1;
  char *pcVar2;
  bool bVar3;
  fp value_00;
  decimal_fp<double> dVar4;
  int *in_stack_ffffffffffffff08;
  bool local_d9;
  size_t local_b8;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  fp f;
  bool use_dragon;
  int exp;
  appender local_78;
  unsigned_long local_70;
  decimal_fp<double> dec;
  appender local_58;
  decimal_fp<float> local_4c;
  decimal_fp<float> dec_1;
  char local_3a;
  byte local_39;
  buffer<char> *pbStack_38;
  bool fixed;
  buffer<char> *buf_local;
  undefined1 auStack_28 [4];
  int precision_local;
  longdouble value_local;
  float_specs local_14;
  float_specs specs_local;
  
  _auStack_28 = value;
  pbStack_38 = buf;
  buf_local._4_4_ = precision;
  local_14 = specs;
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  local_14._4_1_ = specs._4_1_;
  local_39 = local_14._4_1_ == '\x02';
  if ((longdouble)0 < value) {
    local_14._4_4_ = specs._4_4_;
    if (((uint)local_14._4_4_ >> 0x13 & 1) == 0) {
      if (precision < 0) {
        if (((uint)local_14._4_4_ >> 0x12 & 1) == 0) {
          dVar4 = dragonbox::to_decimal<double>((double)value);
          local_70 = dVar4.significand;
          dec.significand._0_4_ = dVar4.exponent;
          appender::back_insert_iterator(&local_78,pbStack_38);
          write<char,_fmt::v8::appender,_unsigned_long,_0>(local_78,local_70);
          specs_local.precision = (int)dec.significand;
        }
        else {
          local_4c = dragonbox::to_decimal<float>((float)value);
          appender::back_insert_iterator(&local_58,pbStack_38);
          write<char,_fmt::v8::appender,_unsigned_int,_0>(local_58,local_4c.significand);
          specs_local.precision = local_4c.exponent;
        }
      }
      else {
        f._12_4_ = 0;
        f.e._3_1_ = 1;
        fp::fp((fp *)&max_double_digits);
        if (((uint)local_14._4_4_ >> 0x12 & 1) == 0) {
          in_stack_ffffffffffffff08 = _auStack_28;
          local_d9 = fp::assign<long_double,_0>((fp *)&max_double_digits,_auStack_28);
        }
        else {
          local_d9 = fp::assign<float,_0>((fp *)&max_double_digits,(float)_auStack_28);
        }
        if (0x2ff < buf_local._4_4_) {
          buf_local._4_4_ = 0x2ff;
        }
        value_00.f = f.f & 0xffffffff;
        value_00.e._0_1_ = local_d9;
        value_00._9_7_ = 0;
        format_dragon(_max_double_digits,value_00,SUB41(buf_local._4_4_,0),(int)pbStack_38,
                      (buffer<char> *)&f.field_0xc,in_stack_ffffffffffffff08);
        if (((local_39 & 1) == 0) && (((uint)local_14._4_4_ >> 0x14 & 1) == 0)) {
          local_b8 = buffer<char>::size(pbStack_38);
          while( true ) {
            bVar3 = false;
            if (local_b8 != 0) {
              pcVar2 = buffer<char>::operator[]<unsigned_long>(pbStack_38,local_b8 - 1);
              bVar3 = *pcVar2 == '0';
            }
            if (!bVar3) break;
            local_b8 = local_b8 - 1;
            f._12_4_ = f._12_4_ + 1;
          }
          buffer<char>::try_resize(pbStack_38,local_b8);
        }
        specs_local.precision = f._12_4_;
      }
    }
    else {
      dec_1 = (decimal_fp<float>)specs;
      specs_local.precision = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  else if ((precision < 1) || (!(bool)local_39)) {
    local_3a = '0';
    buffer<char>::push_back(buf,&local_3a);
    specs_local.precision = 0;
  }
  else {
    tVar1 = to_unsigned<int>(precision);
    buffer<char>::try_resize(buf,(ulong)tVar1);
    pcVar2 = buffer<char>::data(pbStack_38);
    fill_n<char,int>(pcVar2,buf_local._4_4_,'0');
    specs_local.precision = -buf_local._4_4_;
  }
  return specs_local.precision;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}